

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O1

REF_STATUS ref_geom_face_tec_zone(REF_GRID ref_grid,REF_INT id,FILE *file)

{
  REF_NODE pRVar1;
  REF_GEOM ref_geom;
  REF_INT *pRVar2;
  REF_ADJ_ITEM pRVar3;
  REF_DBL *pRVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  REF_STATUS RVar8;
  REF_DBL *__ptr;
  ulong uVar9;
  long lVar10;
  undefined8 uVar11;
  REF_INT RVar12;
  REF_DBL *pRVar13;
  int iVar14;
  ulong uVar15;
  REF_CELL pRVar16;
  char *pcVar17;
  REF_GRID pRVar18;
  long lVar19;
  REF_DBL RVar20;
  double dVar21;
  double dVar22;
  REF_INT local;
  REF_DICT ref_dict_degen;
  REF_DICT ref_dict_jump;
  REF_DICT ref_dict;
  REF_DBL ks;
  REF_DBL kr;
  REF_DBL gap;
  REF_INT sens;
  REF_DBL xyz [3];
  REF_DBL param [2];
  REF_DBL s [3];
  REF_DBL r [3];
  REF_INT nodes [27];
  REF_INT local_180;
  int local_17c;
  REF_CELL local_178;
  REF_DICT local_170;
  REF_DICT local_168;
  REF_DICT local_160;
  REF_DBL local_158;
  REF_DBL local_150;
  REF_DBL local_148;
  int local_140;
  uint local_13c;
  REF_DBL local_138;
  REF_DBL local_130;
  REF_DBL local_128;
  FILE *local_118;
  REF_NODE local_110;
  long local_108;
  REF_GRID local_100;
  REF_DBL local_f8;
  REF_DBL local_f0;
  REF_DBL local_e8 [4];
  REF_DBL local_c8 [4];
  REF_INT local_a8 [3];
  int local_9c;
  
  pRVar1 = ref_grid->node;
  pRVar16 = ref_grid->cell[3];
  ref_geom = ref_grid->geom;
  local_118 = (FILE *)file;
  uVar6 = ref_dict_create(&local_160);
  if (uVar6 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xca9,
           "ref_geom_face_tec_zone",(ulong)uVar6,"create dict");
    return uVar6;
  }
  local_178 = pRVar16;
  local_110 = pRVar1;
  local_100 = ref_grid;
  uVar6 = ref_dict_create(&local_168);
  if (uVar6 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xcaa,
           "ref_geom_face_tec_zone",(ulong)uVar6,"create dict");
    return uVar6;
  }
  uVar6 = ref_dict_create(&local_170);
  if (uVar6 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xcab,
           "ref_geom_face_tec_zone",(ulong)uVar6,"create dict");
    return uVar6;
  }
  uVar9 = 0;
  pRVar16 = local_178;
  if (ref_geom->max < 1) {
    lVar19 = 0;
  }
  else {
    lVar19 = 0;
    do {
      pRVar2 = ref_geom->descr;
      if ((pRVar2[lVar19 * 6] == 2) && (pRVar2[lVar19 * 6 + 1] == id)) {
        uVar6 = pRVar2[lVar19 * 6 + 5];
        if (pRVar2[lVar19 * 6 + 4] == 0) {
          uVar7 = ref_dict_store(local_160,uVar6,(REF_INT)lVar19);
          if (uVar7 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0xcb1,"ref_geom_face_tec_zone",(ulong)uVar7,"mark nodes");
            return uVar7;
          }
          pRVar16 = local_178;
          if ((ref_geom->descr[lVar19 * 6 + 3] != 0) &&
             (uVar6 = ref_dict_store(local_168,uVar6,(REF_INT)lVar19), pRVar16 = local_178,
             uVar6 != 0)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0xcb3,"ref_geom_face_tec_zone",(ulong)uVar6,"mark jump");
            return uVar6;
          }
        }
        else {
          uVar15 = 0xffffffff;
          if (-1 < (int)uVar6) {
            uVar15 = 0xffffffff;
            if ((int)uVar6 < pRVar16->ref_adj->nnode) {
              uVar15 = (ulong)(uint)pRVar16->ref_adj->first[uVar6];
            }
          }
          if ((int)uVar15 != -1) {
            RVar12 = pRVar16->ref_adj->item[(int)uVar15].ref;
            do {
              uVar7 = ref_cell_nodes(pRVar16,RVar12,local_a8);
              if (uVar7 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0xcb7,"ref_geom_face_tec_zone",(ulong)uVar7,"nodes");
                return uVar7;
              }
              if ((local_9c == id) && (uVar7 = ref_dict_store(local_170,RVar12,uVar6), uVar7 != 0))
              {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0xcb9,"ref_geom_face_tec_zone",(ulong)uVar7,"mark degen");
                return uVar7;
              }
              pRVar3 = local_178->ref_adj->item;
              iVar14 = pRVar3[(int)uVar15].next;
              uVar15 = (ulong)iVar14;
              if (uVar15 == 0xffffffffffffffff) {
                RVar12 = -1;
              }
              else {
                RVar12 = pRVar3[uVar15].ref;
              }
              pRVar16 = local_178;
            } while (iVar14 != -1);
          }
        }
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 < ref_geom->max);
  }
  local_180 = (REF_INT)lVar19;
  local_108 = (long)local_160->n;
  local_140 = local_168->n + local_160->n;
  uVar6 = local_170->n + local_140;
  if (0 < pRVar16->max) {
    iVar14 = 0;
    uVar9 = 0;
    do {
      RVar8 = ref_cell_nodes(pRVar16,iVar14,local_a8);
      uVar9 = (ulong)((int)uVar9 + (uint)(local_9c == id && RVar8 == 0));
      iVar14 = iVar14 + 1;
      pRVar16 = local_178;
    } while (iVar14 < local_178->max);
  }
  if ((uVar6 == 0) || ((int)uVar9 == 0)) {
    uVar6 = ref_dict_free(local_170);
    if (uVar6 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xcce,
             "ref_geom_face_tec_zone",(ulong)uVar6,"free degen");
      return uVar6;
    }
    uVar6 = ref_dict_free(local_168);
    if (uVar6 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xccf,
             "ref_geom_face_tec_zone",(ulong)uVar6,"free jump");
      return uVar6;
    }
    uVar6 = ref_dict_free(local_160);
    if (uVar6 == 0) {
      return 0;
    }
    uVar11 = 0xcd0;
    goto LAB_0019b838;
  }
  fprintf(local_118,"zone t=\"face%d\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
          (ulong)(uint)id,(ulong)uVar6,uVar9,"point","fetriangle");
  if ((int)uVar6 < 0) {
    RVar8 = 1;
    pcVar17 = "malloc uv of REF_DBL negative";
LAB_0019b863:
    bVar5 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xcd9,
           "ref_geom_face_tec_zone",pcVar17);
    __ptr = (REF_DBL *)0x0;
  }
  else {
    uVar7 = uVar6 * 2;
    __ptr = (REF_DBL *)malloc((ulong)uVar7 << 3);
    if (__ptr == (REF_DBL *)0x0) {
      RVar8 = 2;
      pcVar17 = "malloc uv of REF_DBL NULL";
      goto LAB_0019b863;
    }
    bVar5 = true;
    RVar8 = 0;
    if (uVar6 != 0) {
      uVar9 = 1;
      if (1 < (int)uVar7) {
        uVar9 = (ulong)uVar7;
      }
      uVar15 = 0;
      do {
        __ptr[uVar15] = -1.0;
        uVar15 = uVar15 + 1;
      } while (uVar9 != uVar15);
    }
  }
  if (!bVar5) {
    return RVar8;
  }
  if (0 < local_178->max) {
    RVar12 = 0;
    do {
      RVar8 = ref_cell_nodes(local_178,RVar12,local_a8);
      if (((RVar8 == 0) && (local_9c == id)) && (0 < local_178->node_per)) {
        lVar19 = 0;
        do {
          uVar6 = ref_geom_find(ref_geom,local_a8[lVar19],2,id,&local_180);
          if (uVar6 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0xcde,"ref_geom_face_tec_zone",(ulong)uVar6,"find");
            return uVar6;
          }
          uVar6 = ref_geom_cell_tuv(ref_geom,local_a8[lVar19],local_a8,2,&local_f8,
                                    (REF_INT *)&local_13c);
          if (uVar6 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0xce1,"ref_geom_face_tec_zone",(ulong)uVar6);
            return uVar6;
          }
          if (ref_geom->descr[(long)local_180 * 6 + 4] == 0) {
            if (local_13c < 2) {
              uVar6 = ref_dict_location(local_160,local_a8[lVar19],&local_17c);
              if (uVar6 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0xce4,"ref_geom_face_tec_zone",(ulong)uVar6);
                return uVar6;
              }
            }
            else {
              uVar6 = ref_dict_location(local_168,local_a8[lVar19],&local_17c);
              if (uVar6 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0xce7,"ref_geom_face_tec_zone",(ulong)uVar6);
                return uVar6;
              }
              local_17c = local_17c + (int)local_108;
            }
          }
          else {
            uVar6 = ref_dict_location(local_170,RVar12,&local_17c);
            if (uVar6 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0xceb,"ref_geom_face_tec_zone",(ulong)uVar6);
              return uVar6;
            }
            local_17c = local_17c + local_140;
          }
          __ptr[(long)local_17c * 2] = local_f8;
          __ptr[local_17c * 2 + 1] = local_f0;
          lVar19 = lVar19 + 1;
        } while (lVar19 < local_178->node_per);
      }
      RVar12 = RVar12 + 1;
    } while (RVar12 < local_178->max);
  }
  local_180 = -1;
  RVar12 = -1;
  if (0 < local_160->n) {
    RVar12 = *local_160->key;
    local_180 = *local_160->value;
  }
  if (0 < local_160->n) {
    pRVar13 = __ptr;
    lVar19 = 1;
    do {
      local_150 = 0.0;
      local_158 = 0.0;
      local_148 = 0.0;
      pRVar4 = local_110->real;
      lVar10 = (long)(RVar12 * 0xf);
      local_138 = pRVar4[lVar10];
      local_130 = pRVar4[lVar10 + 1];
      local_128 = pRVar4[lVar10 + 2];
      if (ref_geom->model != (void *)0x0) {
        uVar6 = ref_egads_face_curvature(ref_geom,local_180,&local_150,local_c8,&local_158,local_e8)
        ;
        if (1 < uVar6) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0xcfd,"ref_geom_face_tec_zone",(ulong)uVar6);
          return uVar6;
        }
        uVar6 = ref_egads_eval_at(ref_geom,2,id,pRVar13,&local_138,(REF_DBL *)0x0);
        if (uVar6 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0xd00,"ref_geom_face_tec_zone",(ulong)uVar6);
          return uVar6;
        }
        uVar6 = ref_egads_gap(ref_geom,RVar12,&local_148);
        if (uVar6 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0xd01,"ref_geom_face_tec_zone",(ulong)uVar6);
          return uVar6;
        }
      }
      if ((ref_geom->meshlink != (void *)0x0) &&
         (uVar6 = ref_meshlink_face_curvature
                            (local_100,local_180,&local_150,local_c8,&local_158,local_e8),
         uVar6 != 0)) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0xd04,"ref_geom_face_tec_zone",(ulong)uVar6);
        return uVar6;
      }
      dVar22 = local_150;
      if (local_150 <= -local_150) {
        dVar22 = -local_150;
      }
      RVar20 = local_158;
      if (local_158 <= -local_158) {
        RVar20 = -local_158;
      }
      dVar21 = dVar22;
      if (dVar22 <= RVar20) {
        dVar21 = RVar20;
      }
      if (RVar20 <= dVar22) {
        dVar22 = RVar20;
      }
      fprintf(local_118," %.16e %.16e %.16e %.16e %.16e %.16e %.16e %16e\n",local_138,local_130,
              local_128,local_148,*pRVar13,pRVar13[1],dVar21,dVar22);
      local_180 = -1;
      RVar12 = -1;
      if (lVar19 < local_160->n) {
        RVar12 = local_160->key[lVar19];
        local_180 = local_160->value[lVar19];
      }
      pRVar13 = pRVar13 + 2;
      bVar5 = lVar19 < local_160->n;
      lVar19 = lVar19 + 1;
    } while (bVar5);
  }
  local_180 = -1;
  RVar12 = -1;
  if (0 < local_168->n) {
    RVar12 = *local_168->key;
    local_180 = *local_168->value;
  }
  if (0 < local_168->n) {
    pRVar13 = __ptr + local_108 * 2;
    lVar19 = 1;
    do {
      local_150 = 0.0;
      local_158 = 0.0;
      local_148 = 0.0;
      pRVar4 = local_110->real;
      lVar10 = (long)(RVar12 * 0xf);
      local_138 = pRVar4[lVar10];
      local_130 = pRVar4[lVar10 + 1];
      local_128 = pRVar4[lVar10 + 2];
      if (ref_geom->model != (void *)0x0) {
        uVar6 = ref_egads_face_curvature(ref_geom,local_180,&local_150,local_c8,&local_158,local_e8)
        ;
        if (1 < uVar6) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0xd15,"ref_geom_face_tec_zone",(ulong)uVar6);
          return uVar6;
        }
        uVar6 = ref_egads_eval_at(ref_geom,2,id,pRVar13,&local_138,(REF_DBL *)0x0);
        if (uVar6 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0xd18,"ref_geom_face_tec_zone",(ulong)uVar6);
          return uVar6;
        }
        uVar6 = ref_egads_gap(ref_geom,RVar12,&local_148);
        if (uVar6 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0xd19,"ref_geom_face_tec_zone",(ulong)uVar6);
          return uVar6;
        }
      }
      dVar22 = local_150;
      if (local_150 <= -local_150) {
        dVar22 = -local_150;
      }
      RVar20 = local_158;
      if (local_158 <= -local_158) {
        RVar20 = -local_158;
      }
      if (dVar22 <= RVar20) {
        dVar22 = RVar20;
      }
      fprintf(local_118," %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n",local_138,local_130,
              local_128,local_148,*pRVar13,pRVar13[1],dVar22,dVar22);
      local_180 = -1;
      RVar12 = -1;
      if (lVar19 < local_168->n) {
        RVar12 = local_168->key[lVar19];
        local_180 = local_168->value[lVar19];
      }
      pRVar13 = pRVar13 + 2;
      bVar5 = lVar19 < local_168->n;
      lVar19 = lVar19 + 1;
    } while (bVar5);
  }
  if (local_170->n < 1) {
    uVar6 = 0xffffffff;
  }
  else {
    uVar6 = *local_170->value;
  }
  if (0 < local_170->n) {
    pRVar18 = (REF_GRID)(long)local_140;
    lVar19 = 0;
    local_100 = pRVar18;
    do {
      local_150 = 0.0;
      local_158 = 0.0;
      local_148 = 0.0;
      pRVar13 = local_110->real;
      lVar10 = (long)(int)(uVar6 * 0xf);
      local_138 = pRVar13[lVar10];
      local_130 = pRVar13[lVar10 + 1];
      local_128 = pRVar13[lVar10 + 2];
      if (ref_geom->model != (void *)0x0) {
        RVar12 = -1;
        uVar9 = 0xffffffff;
        if (-1 < (int)uVar6) {
          uVar9 = 0xffffffff;
          if ((int)uVar6 < ref_geom->ref_adj->nnode) {
            uVar9 = (ulong)(uint)ref_geom->ref_adj->first[uVar6];
          }
        }
        if ((int)uVar9 != -1) {
          RVar12 = ref_geom->ref_adj->item[(int)uVar9].ref;
        }
        while (pRVar18 = local_100, (int)uVar9 != -1) {
          if (((ref_geom->descr[RVar12 * 6] == 2) && (ref_geom->descr[(int)(RVar12 * 6 | 1)] == id))
             && (uVar7 = ref_egads_face_curvature
                                   (ref_geom,RVar12,&local_150,local_c8,&local_158,local_e8),
                1 < uVar7)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0xd2d,"ref_geom_face_tec_zone",(ulong)uVar7);
            return uVar7;
          }
          pRVar3 = ref_geom->ref_adj->item;
          uVar9 = (ulong)pRVar3[(int)uVar9].next;
          if (uVar9 == 0xffffffffffffffff) {
            RVar12 = -1;
          }
          else {
            RVar12 = pRVar3[uVar9].ref;
          }
        }
        local_180 = RVar12;
        uVar7 = ref_egads_eval_at(ref_geom,2,id,__ptr + ((long)local_100->cell + lVar19 + -0x10) * 2
                                  ,&local_138,(REF_DBL *)0x0);
        if (uVar7 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0xd32,"ref_geom_face_tec_zone",(ulong)uVar7);
          return uVar7;
        }
        uVar6 = ref_egads_gap(ref_geom,uVar6,&local_148);
        if (uVar6 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0xd33,"ref_geom_face_tec_zone",(ulong)uVar6);
          return uVar6;
        }
      }
      dVar22 = local_150;
      if (local_150 <= -local_150) {
        dVar22 = -local_150;
      }
      RVar20 = local_158;
      if (local_158 <= -local_158) {
        RVar20 = -local_158;
      }
      if (dVar22 <= RVar20) {
        dVar22 = RVar20;
      }
      lVar10 = (long)pRVar18->cell + lVar19 + -0x10;
      fprintf(local_118," %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n",local_138,local_130,
              local_128,local_148,__ptr[lVar10 * 2],__ptr[lVar10 * 2 + 1],dVar22,dVar22);
      lVar19 = lVar19 + 1;
      uVar6 = 0xffffffff;
      if (lVar19 < local_170->n) {
        uVar6 = local_170->value[lVar19];
      }
    } while (lVar19 < local_170->n);
  }
  if (__ptr != (REF_DBL *)0x0) {
    free(__ptr);
  }
  if (0 < local_178->max) {
    iVar14 = 0;
    do {
      RVar8 = ref_cell_nodes(local_178,iVar14,local_a8);
      if ((RVar8 == 0) && (local_9c == id)) {
        if (0 < local_178->node_per) {
          lVar19 = 0;
          do {
            uVar6 = ref_geom_find(ref_geom,local_a8[lVar19],2,id,&local_180);
            if (uVar6 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0xd41,"ref_geom_face_tec_zone",(ulong)uVar6,"find");
              return uVar6;
            }
            uVar6 = ref_geom_cell_tuv(ref_geom,local_a8[lVar19],local_a8,2,&local_f8,
                                      (REF_INT *)&local_13c);
            if (uVar6 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0xd44,"ref_geom_face_tec_zone",(ulong)uVar6,"cell tuv");
              return uVar6;
            }
            if (ref_geom->descr[(long)local_180 * 6 + 4] == 0) {
              if (local_13c < 2) {
                uVar6 = ref_dict_location(local_160,local_a8[lVar19],&local_17c);
                if (uVar6 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                         ,0xd47,"ref_geom_face_tec_zone",(ulong)uVar6,"localize");
                  return uVar6;
                }
              }
              else {
                uVar6 = ref_dict_location(local_168,local_a8[lVar19],&local_17c);
                if (uVar6 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                         ,0xd4a,"ref_geom_face_tec_zone",(ulong)uVar6,"localize");
                  return uVar6;
                }
                local_17c = local_17c + (int)local_108;
              }
            }
            else {
              uVar6 = ref_dict_location(local_170,iVar14,&local_17c);
              if (uVar6 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0xd4e,"ref_geom_face_tec_zone",(ulong)uVar6,"localize");
                return uVar6;
              }
              local_17c = local_17c + local_140;
            }
            fprintf(local_118," %d",(ulong)(local_17c + 1));
            lVar19 = lVar19 + 1;
          } while (lVar19 < local_178->node_per);
        }
        fputc(10,local_118);
      }
      iVar14 = iVar14 + 1;
    } while (iVar14 < local_178->max);
  }
  uVar6 = ref_dict_free(local_170);
  if (uVar6 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xd57,
           "ref_geom_face_tec_zone",(ulong)uVar6,"free degen");
    return uVar6;
  }
  uVar6 = ref_dict_free(local_168);
  if (uVar6 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xd58,
           "ref_geom_face_tec_zone",(ulong)uVar6,"free jump");
    return uVar6;
  }
  uVar6 = ref_dict_free(local_160);
  if (uVar6 == 0) {
    return 0;
  }
  uVar11 = 0xd59;
LAB_0019b838:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar11,
         "ref_geom_face_tec_zone",(ulong)uVar6,"free dict");
  return uVar6;
}

Assistant:

REF_FCN REF_STATUS ref_geom_face_tec_zone(REF_GRID ref_grid, REF_INT id,
                                          FILE *file) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_DICT ref_dict, ref_dict_jump, ref_dict_degen;
  REF_INT geom, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT item2, item, local, node;
  REF_INT nnode, nnode_sens0, nnode_degen, ntri;
  REF_INT sens;
  REF_DBL *uv, param[2];
  REF_DBL kr, r[3], ks, s[3], xyz[3], kmin, kmax, gap;

  RSS(ref_dict_create(&ref_dict), "create dict");
  RSS(ref_dict_create(&ref_dict_jump), "create dict");
  RSS(ref_dict_create(&ref_dict_degen), "create dict");

  each_ref_geom_face(ref_geom, geom) {
    node = ref_geom_node(ref_geom, geom);
    if (id == ref_geom_id(ref_geom, geom)) {
      if (0 == ref_geom_degen(ref_geom, geom)) {
        RSS(ref_dict_store(ref_dict, node, geom), "mark nodes");
        if (0 != ref_geom_jump(ref_geom, geom)) {
          RSS(ref_dict_store(ref_dict_jump, node, geom), "mark jump");
        }
      } else {
        each_ref_cell_having_node(ref_cell, node, item, cell) {
          RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
          if (id == nodes[3]) {
            RSS(ref_dict_store(ref_dict_degen, cell, node), "mark degen");
          }
        }
      }
    }
  }

  nnode_sens0 = ref_dict_n(ref_dict);
  nnode_degen = ref_dict_n(ref_dict) + ref_dict_n(ref_dict_jump);
  nnode = ref_dict_n(ref_dict) + ref_dict_n(ref_dict_jump) +
          ref_dict_n(ref_dict_degen);

  ntri = 0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (id == nodes[3]) {
      ntri++;
    }
  }

  /* skip degenerate */
  if (0 == nnode || 0 == ntri) {
    RSS(ref_dict_free(ref_dict_degen), "free degen");
    RSS(ref_dict_free(ref_dict_jump), "free jump");
    RSS(ref_dict_free(ref_dict), "free dict");
    return REF_SUCCESS;
  }

  fprintf(
      file,
      "zone t=\"face%d\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
      id, nnode, ntri, "point", "fetriangle");

  ref_malloc_init(uv, 2 * nnode, REF_DBL, -1.0);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (id == nodes[3]) {
      each_ref_cell_cell_node(ref_cell, node) {
        RSS(ref_geom_find(ref_geom, nodes[node], REF_GEOM_FACE, id, &geom),
            "find");
        RSS(ref_geom_cell_tuv(ref_geom, nodes[node], nodes, REF_GEOM_FACE,
                              param, &sens),
            "cell tuv");
        if (0 == ref_geom_degen(ref_geom, geom)) {
          if (0 == sens || 1 == sens) {
            RSS(ref_dict_location(ref_dict, nodes[node], &local), "localize");
          } else {
            RSS(ref_dict_location(ref_dict_jump, nodes[node], &local),
                "localize");
            local += nnode_sens0;
          }
        } else {
          RSS(ref_dict_location(ref_dict_degen, cell, &local), "localize");
          local += nnode_degen;
        }
        uv[0 + 2 * local] = param[0];
        uv[1 + 2 * local] = param[1];
      }
    }
  }

  each_ref_dict_key_value(ref_dict, item, node, geom) {
    kr = 0;
    ks = 0;
    gap = 0;
    xyz[0] = ref_node_xyz(ref_node, 0, node);
    xyz[1] = ref_node_xyz(ref_node, 1, node);
    xyz[2] = ref_node_xyz(ref_node, 2, node);
    if (ref_geom_model_loaded(ref_geom)) {
      RXS(ref_egads_face_curvature(ref_geom, geom, &kr, r, &ks, s), REF_FAILURE,
          "curve");
      RSS(ref_egads_eval_at(ref_geom, REF_GEOM_FACE, id, &(uv[2 * item]), xyz,
                            NULL),
          "eval at");
      RSS(ref_egads_gap(ref_geom, node, &gap), "gap")
    }
    if (ref_geom_meshlinked(ref_geom)) {
      RSS(ref_meshlink_face_curvature(ref_grid, geom, &kr, r, &ks, s), "curve");
    }
    kmax = MAX(ABS(kr), ABS(ks));
    kmin = MIN(ABS(kr), ABS(ks));
    fprintf(file, " %.16e %.16e %.16e %.16e %.16e %.16e %.16e %16e\n", xyz[0],
            xyz[1], xyz[2], gap, uv[0 + 2 * item], uv[1 + 2 * item], kmax,
            kmin);
  }
  each_ref_dict_key_value(ref_dict_jump, item, node, geom) {
    kr = 0;
    ks = 0;
    gap = 0;
    xyz[0] = ref_node_xyz(ref_node, 0, node);
    xyz[1] = ref_node_xyz(ref_node, 1, node);
    xyz[2] = ref_node_xyz(ref_node, 2, node);
    if (ref_geom_model_loaded(ref_geom)) {
      RXS(ref_egads_face_curvature(ref_geom, geom, &kr, r, &ks, s), REF_FAILURE,
          "curve");
      RSS(ref_egads_eval_at(ref_geom, REF_GEOM_FACE, id,
                            &(uv[2 * (nnode_sens0 + item)]), xyz, NULL),
          "eval at");
      RSS(ref_egads_gap(ref_geom, node, &gap), "gap")
    }
    kmax = MAX(ABS(kr), ABS(ks));
    kmin = MAX(ABS(kr), ABS(ks));
    fprintf(file, " %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n", xyz[0],
            xyz[1], xyz[2], gap, uv[0 + 2 * (nnode_sens0 + item)],
            uv[1 + 2 * (nnode_sens0 + item)], kmax, kmin);
  }
  each_ref_dict_key_value(ref_dict_degen, item, cell, node) {
    kr = 0;
    ks = 0;
    gap = 0;
    xyz[0] = ref_node_xyz(ref_node, 0, node);
    xyz[1] = ref_node_xyz(ref_node, 1, node);
    xyz[2] = ref_node_xyz(ref_node, 2, node);
    if (ref_geom_model_loaded(ref_geom)) {
      each_ref_geom_having_node(ref_geom, node, item2, geom) {
        if (ref_geom_type(ref_geom, geom) == REF_GEOM_FACE &&
            ref_geom_id(ref_geom, geom) == id) {
          RXS(ref_egads_face_curvature(ref_geom, geom, &kr, r, &ks, s),
              REF_FAILURE, "curve");
        }
      }
      RSS(ref_egads_eval_at(ref_geom, REF_GEOM_FACE, id,
                            &(uv[2 * (nnode_degen + item)]), xyz, NULL),
          "eval at");
      RSS(ref_egads_gap(ref_geom, node, &gap), "gap")
    }
    kmax = MAX(ABS(kr), ABS(ks));
    kmin = MAX(ABS(kr), ABS(ks));
    fprintf(file, " %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n", xyz[0],
            xyz[1], xyz[2], gap, uv[0 + 2 * (nnode_degen + item)],
            uv[1 + 2 * (nnode_degen + item)], kmax, kmin);
  }
  ref_free(uv);

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (id == nodes[3]) {
      each_ref_cell_cell_node(ref_cell, node) {
        RSS(ref_geom_find(ref_geom, nodes[node], REF_GEOM_FACE, id, &geom),
            "find");
        RSS(ref_geom_cell_tuv(ref_geom, nodes[node], nodes, REF_GEOM_FACE,
                              param, &sens),
            "cell tuv");
        if (0 == ref_geom_degen(ref_geom, geom)) {
          if (0 == sens || 1 == sens) {
            RSS(ref_dict_location(ref_dict, nodes[node], &local), "localize");
          } else {
            RSS(ref_dict_location(ref_dict_jump, nodes[node], &local),
                "localize");
            local += nnode_sens0;
          }
        } else {
          RSS(ref_dict_location(ref_dict_degen, cell, &local), "localize");
          local += nnode_degen;
        }
        fprintf(file, " %d", local + 1);
      }
      fprintf(file, "\n");
    }
  }

  RSS(ref_dict_free(ref_dict_degen), "free degen");
  RSS(ref_dict_free(ref_dict_jump), "free jump");
  RSS(ref_dict_free(ref_dict), "free dict");

  return REF_SUCCESS;
}